

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::
DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
           *this,int num_args,ArgHandler *arg_handler)

{
  bool bVar1;
  NumericExpr NStack_38;
  
  if (num_args < 1) {
    num_args = 0;
  }
  while (bVar1 = num_args != 0, num_args = num_args + -1, bVar1) {
    ReadNumericExpr_abi_cxx11_(&NStack_38,this,false);
    std::__cxx11::string::~string((string *)&NStack_38);
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }